

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O1

void Msat_SolverSort(Msat_Clause_t **array,int size,double seed)

{
  Msat_Clause_t **ppMVar1;
  Msat_Clause_t *pC;
  Msat_Clause_t *pMVar2;
  ulong uVar3;
  ulong uVar4;
  Msat_Clause_t **ppMVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  
  for (; 0xf < size; size = size - (int)lVar6) {
    pC = array[(int)((double)size * 0.38433611597136413)];
    lVar6 = -1;
    uVar4 = (ulong)(uint)size;
    while( true ) {
      lVar6 = (long)(int)lVar6;
      ppMVar5 = array + lVar6;
      do {
        lVar6 = lVar6 + 1;
        ppMVar1 = ppMVar5 + 1;
        ppMVar5 = ppMVar5 + 1;
        fVar7 = Msat_ClauseReadActivity(*ppMVar1);
        fVar8 = Msat_ClauseReadActivity(pC);
      } while (fVar7 < fVar8);
      uVar3 = (long)(int)uVar4;
      do {
        uVar4 = uVar3 - 1;
        fVar7 = Msat_ClauseReadActivity(pC);
        fVar8 = Msat_ClauseReadActivity(array[uVar3 - 1]);
        uVar3 = uVar4;
      } while (fVar7 < fVar8);
      if ((long)uVar4 <= lVar6) break;
      pMVar2 = *ppMVar5;
      *ppMVar5 = array[uVar4];
      array[uVar4] = pMVar2;
    }
    Msat_SolverSort(array,(int)lVar6,(double)CONCAT44(extraout_XMM0_Db,fVar8));
    array = ppMVar5;
  }
  Msat_SolverSortSelection(array,size);
  return;
}

Assistant:

void Msat_SolverSort( Msat_Clause_t ** array, int size, double seed )
{
    if (size <= 15)
        Msat_SolverSortSelection( array, size );
    else
    {
        Msat_Clause_t *   pivot = array[irand(seed, size)];
        Msat_Clause_t *   tmp;
        int              i = -1;
        int              j = size;

        for(;;)
        {
            do i++; while( Msat_ClauseReadActivity(array[i]) < Msat_ClauseReadActivity(pivot) );
            do j--; while( Msat_ClauseReadActivity(pivot) < Msat_ClauseReadActivity(array[j]) );

            if ( i >= j ) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        Msat_SolverSort(array    , i     , seed);
        Msat_SolverSort(&array[i], size-i, seed);
    }
}